

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O3

void __thiscall spirv_cross::CompilerHLSL::emit_hlsl_entry_point(CompilerHLSL *this)

{
  ParsedIR *this_00;
  pointer pcVar1;
  uint __val;
  ExecutionModel EVar2;
  size_t sVar3;
  Variant *pVVar4;
  pointer pcVar5;
  _Alloc_hider _Var6;
  char cVar7;
  bool bVar8;
  char cVar9;
  uint uVar10;
  SPIRVariable *pSVar11;
  SPIRType *pSVar12;
  mapped_type *pmVar13;
  SPIREntryPoint *pSVar14;
  SPIRConstant *pSVar15;
  runtime_error *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar16;
  string *psVar17;
  char *pcVar18;
  uint uVar19;
  uint uVar20;
  TypedID<(spirv_cross::Types)0> *pTVar21;
  undefined1 *puVar22;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar23;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *elem;
  long lVar24;
  TypedID<(spirv_cross::Types)0> *pTVar25;
  _Hash_node_base *p_Var26;
  uint32_t i_1;
  uint32_t i;
  int iVar27;
  long lVar28;
  ulong uVar29;
  string y_expr;
  string z_expr;
  SpecializationConstant wg_y;
  bool legacy;
  undefined3 uStack_1267;
  uint32_t uStack_1264;
  undefined1 local_1258 [16];
  SpecializationConstant wg_z;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  arguments;
  string x_expr;
  
  arguments.
  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &arguments.stack_storage;
  arguments.
  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .buffer_size = 0;
  arguments.buffer_capacity = 8;
  if (this->require_input == true) {
    x_expr._M_dataplus._M_p = (pointer)&x_expr.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&x_expr,"SPIRV_Cross_Input stage_input","");
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(&arguments,&x_expr);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)x_expr._M_dataplus._M_p != &x_expr.field_2) {
      operator_delete(x_expr._M_dataplus._M_p);
    }
  }
  this_00 = &(this->super_CompilerGLSL).super_Compiler.ir;
  ParsedIR::create_loop_hard_lock(this_00);
  sVar3 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar3 != 0) {
    pTVar21 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    lVar28 = 0;
    do {
      uVar10 = *(uint *)((long)&pTVar21->id + lVar28);
      pVVar4 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar4[uVar10].type == TypeVariable) {
        pSVar11 = Variant::get<spirv_cross::SPIRVariable>(pVVar4 + uVar10);
        pSVar12 = Variant::get<spirv_cross::SPIRType>
                            ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                             super_VectorView<spirv_cross::Variant>.ptr +
                             *(uint *)&(pSVar11->super_IVariant).field_0xc);
        pmVar13 = ::std::__detail::
                  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&(this->super_CompilerGLSL).super_Compiler.ir.meta,
                               &(pSVar12->super_IVariant).self);
        if (((((pSVar11->storage | StorageClassUniform) == StorageClassOutput) &&
             (((pmVar13->decoration).decoration_flags.lower & 4) != 0)) &&
            (bVar8 = Compiler::is_builtin_variable((Compiler *)this,pSVar11), !bVar8)) &&
           (bVar8 = Compiler::interface_variable_exists_in_entry_point
                              ((Compiler *)this,(pSVar11->super_IVariant).self.id), bVar8)) {
          if (pSVar11->storage == StorageClassOutput) {
            pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                      (&legacy,this,(ulong)(pSVar11->super_IVariant).self.id);
            psVar17 = &z_expr;
            join<char_const(&)[13],std::__cxx11::string>
                      (psVar17,(spirv_cross *)"stage_output",(char (*) [13])&legacy,pbVar16);
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1a])
                      (&y_expr,this,pSVar12,psVar17,0);
            join<char_const(&)[5],std::__cxx11::string>
                      (&x_expr,(spirv_cross *)0x2daadc,(char (*) [5])&y_expr,psVar17);
            SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
            ::push_back(&arguments,&x_expr);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)x_expr._M_dataplus._M_p != &x_expr.field_2) {
              operator_delete(x_expr._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)y_expr._M_dataplus._M_p != &y_expr.field_2) {
              operator_delete(y_expr._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)z_expr._M_dataplus._M_p != &z_expr.field_2) {
              operator_delete(z_expr._M_dataplus._M_p);
            }
            puVar22 = (undefined1 *)CONCAT44(uStack_1264,_legacy);
            if (puVar22 != local_1258) {
LAB_00216a33:
              operator_delete(puVar22);
            }
          }
          else if (pSVar11->storage == StorageClassInput) {
            pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                      (&legacy,this,(ulong)(pSVar11->super_IVariant).self.id);
            psVar17 = &z_expr;
            join<char_const(&)[12],std::__cxx11::string>
                      (psVar17,(spirv_cross *)0x2e599d,(char (*) [12])&legacy,pbVar16);
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1a])(&y_expr,this,pSVar12);
            join<char_const(&)[4],std::__cxx11::string>
                      (&x_expr,(spirv_cross *)"in ",(char (*) [4])&y_expr,psVar17);
            SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
            ::push_back(&arguments,&x_expr);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)x_expr._M_dataplus._M_p != &x_expr.field_2) {
              operator_delete(x_expr._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)y_expr._M_dataplus._M_p != &y_expr.field_2) {
              operator_delete(y_expr._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)z_expr._M_dataplus._M_p != &z_expr.field_2) {
              operator_delete(z_expr._M_dataplus._M_p);
            }
            puVar22 = (undefined1 *)CONCAT44(uStack_1264,_legacy);
            if (puVar22 != local_1258) goto LAB_00216a33;
          }
        }
      }
      lVar28 = lVar28 + 4;
    } while (sVar3 << 2 != lVar28);
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)&wg_y);
  pSVar14 = Compiler::get_entry_point((Compiler *)this);
  if (pSVar14->model == ExecutionModelFragment) {
    if (((pSVar14->flags).lower & 0x200) != 0) {
      CompilerGLSL::statement<char_const(&)[20]>
                (&this->super_CompilerGLSL,(char (*) [20])"[earlydepthstencil]");
    }
  }
  else if (pSVar14->model == ExecutionModelGLCompute) {
    _legacy = 0;
    wg_y.id.id = 0;
    wg_z.id.id = 0;
    Compiler::get_work_group_size_specialization_constants
              ((Compiler *)this,(SpecializationConstant *)&legacy,&wg_y,&wg_z);
    uVar10 = (pSVar14->workgroup_size).y;
    __val = (pSVar14->workgroup_size).z;
    if ((ulong)_legacy == 0) {
      uVar20 = (pSVar14->workgroup_size).x;
      cVar9 = '\x01';
      if (9 < uVar20) {
        uVar19 = uVar20;
        cVar7 = '\x04';
        do {
          cVar9 = cVar7;
          if (uVar19 < 100) {
            cVar9 = cVar9 + -2;
            goto LAB_00216b68;
          }
          if (uVar19 < 1000) {
            cVar9 = cVar9 + -1;
            goto LAB_00216b68;
          }
          if (uVar19 < 10000) goto LAB_00216b68;
          bVar8 = 99999 < uVar19;
          uVar19 = uVar19 / 10000;
          cVar7 = cVar9 + '\x04';
        } while (bVar8);
        cVar9 = cVar9 + '\x01';
      }
LAB_00216b68:
      x_expr._M_dataplus._M_p = (pointer)&x_expr.field_2;
      ::std::__cxx11::string::_M_construct((ulong)&x_expr,cVar9);
      ::std::__detail::__to_chars_10_impl<unsigned_int>
                (x_expr._M_dataplus._M_p,(uint)x_expr._M_string_length,uVar20);
    }
    else {
      pSVar15 = Variant::get<spirv_cross::SPIRConstant>
                          ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr + _legacy);
      x_expr._M_dataplus._M_p = (pointer)&x_expr.field_2;
      pcVar5 = (pSVar15->specialization_constant_macro_name)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&x_expr,pcVar5,
                 pcVar5 + (pSVar15->specialization_constant_macro_name)._M_string_length);
    }
    if ((ulong)wg_y.id.id == 0) {
      cVar9 = '\x01';
      if (9 < uVar10) {
        uVar20 = uVar10;
        cVar7 = '\x04';
        do {
          cVar9 = cVar7;
          if (uVar20 < 100) {
            cVar9 = cVar9 + -2;
            goto LAB_00216c2b;
          }
          if (uVar20 < 1000) {
            cVar9 = cVar9 + -1;
            goto LAB_00216c2b;
          }
          if (uVar20 < 10000) goto LAB_00216c2b;
          bVar8 = 99999 < uVar20;
          uVar20 = uVar20 / 10000;
          cVar7 = cVar9 + '\x04';
        } while (bVar8);
        cVar9 = cVar9 + '\x01';
      }
LAB_00216c2b:
      y_expr._M_dataplus._M_p = (pointer)&y_expr.field_2;
      ::std::__cxx11::string::_M_construct((ulong)&y_expr,cVar9);
      ::std::__detail::__to_chars_10_impl<unsigned_int>
                (y_expr._M_dataplus._M_p,(uint)y_expr._M_string_length,uVar10);
    }
    else {
      pSVar15 = Variant::get<spirv_cross::SPIRConstant>
                          ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr + wg_y.id.id);
      y_expr._M_dataplus._M_p = (pointer)&y_expr.field_2;
      pcVar5 = (pSVar15->specialization_constant_macro_name)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&y_expr,pcVar5,
                 pcVar5 + (pSVar15->specialization_constant_macro_name)._M_string_length);
    }
    if ((ulong)wg_z.id.id == 0) {
      cVar9 = '\x01';
      if (9 < __val) {
        uVar10 = __val;
        cVar7 = '\x04';
        do {
          cVar9 = cVar7;
          if (uVar10 < 100) {
            cVar9 = cVar9 + -2;
            goto LAB_00216cf4;
          }
          if (uVar10 < 1000) {
            cVar9 = cVar9 + -1;
            goto LAB_00216cf4;
          }
          if (uVar10 < 10000) goto LAB_00216cf4;
          bVar8 = 99999 < uVar10;
          uVar10 = uVar10 / 10000;
          cVar7 = cVar9 + '\x04';
        } while (bVar8);
        cVar9 = cVar9 + '\x01';
      }
LAB_00216cf4:
      z_expr._M_dataplus._M_p = (pointer)&z_expr.field_2;
      ::std::__cxx11::string::_M_construct((ulong)&z_expr,cVar9);
      ::std::__detail::__to_chars_10_impl<unsigned_int>
                (z_expr._M_dataplus._M_p,(uint)z_expr._M_string_length,__val);
    }
    else {
      pSVar15 = Variant::get<spirv_cross::SPIRConstant>
                          ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr + wg_z.id.id);
      z_expr._M_dataplus._M_p = (pointer)&z_expr.field_2;
      pcVar5 = (pSVar15->specialization_constant_macro_name)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&z_expr,pcVar5,
                 pcVar5 + (pSVar15->specialization_constant_macro_name)._M_string_length);
    }
    CompilerGLSL::
    statement<char_const(&)[13],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3]>
              (&this->super_CompilerGLSL,(char (*) [13])"[numthreads(",&x_expr,
               (char (*) [3])0x2f06f8,&y_expr,(char (*) [3])0x2f06f8,&z_expr,(char (*) [3])")]");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)z_expr._M_dataplus._M_p != &z_expr.field_2) {
      operator_delete(z_expr._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)y_expr._M_dataplus._M_p != &y_expr.field_2) {
      operator_delete(y_expr._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)x_expr._M_dataplus._M_p != &x_expr.field_2) {
      operator_delete(x_expr._M_dataplus._M_p);
    }
  }
  pcVar18 = "void ";
  if (this->require_output != false) {
    pcVar18 = "SPIRV_Cross_Output ";
  }
  x_expr.field_2._M_allocated_capacity = 0;
  x_expr._M_dataplus._M_p = (pointer)0x0;
  x_expr._M_string_length = 0;
  z_expr._M_dataplus._M_p = pcVar18;
  StringStream<4096UL,_4096UL>::reset((StringStream<4096UL,_4096UL> *)&x_expr);
  if (arguments.
      super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .buffer_size != 0) {
    pbVar23 = arguments.
              super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .ptr + arguments.
                     super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .buffer_size;
    pbVar16 = arguments.
              super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .ptr;
    do {
      StringStream<4096UL,_4096UL>::append
                ((StringStream<4096UL,_4096UL> *)&x_expr,(pbVar16->_M_dataplus)._M_p,
                 pbVar16->_M_string_length);
      if (pbVar16 !=
          arguments.
          super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .ptr + (arguments.
                  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .buffer_size - 1)) {
        StringStream<4096UL,_4096UL>::append((StringStream<4096UL,_4096UL> *)&x_expr,", ",2);
      }
      pbVar16 = pbVar16 + 1;
    } while (pbVar16 != pbVar23);
  }
  StringStream<4096ul,4096ul>::str_abi_cxx11_(&y_expr,&x_expr);
  StringStream<4096UL,_4096UL>::~StringStream((StringStream<4096UL,_4096UL> *)&x_expr);
  CompilerGLSL::statement<char_const*,char_const(&)[6],std::__cxx11::string,char_const(&)[2]>
            (&this->super_CompilerGLSL,(char **)&z_expr,(char (*) [6])"main(",&y_expr,
             (char (*) [2])0x2dfe76);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)y_expr._M_dataplus._M_p != &y_expr.field_2) {
    operator_delete(y_expr._M_dataplus._M_p);
  }
  CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
  y_expr._M_string_length = (size_type)&legacy;
  legacy = *(uint *)&(this->super_CompilerGLSL).field_0x241c < 0x1f;
  uVar29 = 0;
  y_expr._M_dataplus._M_p = (pointer)this;
  do {
    if (((this->super_CompilerGLSL).super_Compiler.active_input_builtins.lower >> (uVar29 & 0x3f) &
        1) != 0) {
      emit_hlsl_entry_point::anon_class_16_2_46e5c3c4::operator()
                ((anon_class_16_2_46e5c3c4 *)&y_expr,(uint32_t)uVar29);
    }
    uVar29 = uVar29 + 1;
  } while (uVar29 != 0x40);
  sVar3 = (this->super_CompilerGLSL).super_Compiler.active_input_builtins.higher._M_h.
          _M_element_count;
  if (sVar3 != 0) {
    pcVar5 = (pointer)((long)&x_expr.field_2 + 8);
    x_expr._M_string_length = 0;
    x_expr.field_2._M_allocated_capacity = 8;
    x_expr._M_dataplus._M_p = pcVar5;
    SmallVector<unsigned_int,_8UL>::reserve((SmallVector<unsigned_int,_8UL> *)&x_expr,sVar3);
    p_Var26 = (this->super_CompilerGLSL).super_Compiler.active_input_builtins.higher._M_h.
              _M_before_begin._M_nxt;
    if (p_Var26 != (_Hash_node_base *)0x0) {
      do {
        SmallVector<unsigned_int,_8UL>::reserve
                  ((SmallVector<unsigned_int,_8UL> *)&x_expr,x_expr._M_string_length + 1);
        *(undefined4 *)(x_expr._M_dataplus._M_p + x_expr._M_string_length * 4) =
             *(undefined4 *)&p_Var26[1]._M_nxt;
        x_expr._M_string_length = x_expr._M_string_length + 1;
        p_Var26 = p_Var26->_M_nxt;
      } while (p_Var26 != (_Hash_node_base *)0x0);
    }
    _Var6._M_p = x_expr._M_dataplus._M_p;
    if (x_expr._M_string_length != 0) {
      pcVar1 = x_expr._M_dataplus._M_p + x_expr._M_string_length * 4;
      lVar28 = 0x3f;
      if (x_expr._M_string_length != 0) {
        for (; x_expr._M_string_length >> lVar28 == 0; lVar28 = lVar28 + -1) {
        }
      }
      ::std::__introsort_loop<unsigned_int*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (x_expr._M_dataplus._M_p,pcVar1,((uint)lVar28 ^ 0x3f) * 2 ^ 0x7e);
      ::std::__final_insertion_sort<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>
                (_Var6._M_p,pcVar1);
      _Var6 = x_expr._M_dataplus;
      if (x_expr._M_string_length != 0) {
        lVar24 = x_expr._M_string_length << 2;
        lVar28 = 0;
        do {
          emit_hlsl_entry_point::anon_class_16_2_46e5c3c4::operator()
                    ((anon_class_16_2_46e5c3c4 *)&y_expr,*(uint32_t *)(_Var6._M_p + lVar28));
          lVar28 = lVar28 + 4;
        } while (lVar24 != lVar28);
      }
    }
    x_expr._M_string_length = 0;
    if (x_expr._M_dataplus._M_p != pcVar5) {
      free(x_expr._M_dataplus._M_p);
    }
  }
  ParsedIR::create_loop_hard_lock(this_00);
  sVar3 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar3 != 0) {
    pTVar21 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    pTVar25 = pTVar21 + sVar3;
    do {
      pVVar4 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar4[pTVar21->id].type == TypeVariable) {
        pSVar11 = Variant::get<spirv_cross::SPIRVariable>(pVVar4 + pTVar21->id);
        pSVar12 = Variant::get<spirv_cross::SPIRType>
                            ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                             super_VectorView<spirv_cross::Variant>.ptr +
                             *(uint *)&(pSVar11->super_IVariant).field_0xc);
        pmVar13 = ::std::__detail::
                  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&(this->super_CompilerGLSL).super_Compiler.ir.meta,
                               &(pSVar12->super_IVariant).self);
        if (pSVar11->storage == StorageClassInput) {
          if (((pmVar13->decoration).decoration_flags.lower & 4) == 0) {
            if ((pSVar11->remapped_variable == false) && (pSVar12->pointer == true)) {
              EVar2 = pSVar14->model;
              bVar8 = Compiler::is_builtin_variable((Compiler *)this,pSVar11);
              if ((!bVar8) &&
                 (bVar8 = Compiler::interface_variable_exists_in_entry_point
                                    ((Compiler *)this,(pSVar11->super_IVariant).self.id), bVar8)) {
                (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                          (&x_expr,this,(ulong)(pSVar11->super_IVariant).self.id,1);
                pSVar12 = Variant::get<spirv_cross::SPIRType>
                                    ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                                     super_VectorView<spirv_cross::Variant>.ptr +
                                     *(uint *)&(pSVar11->super_IVariant).field_0xc);
                if ((EVar2 == ExecutionModelVertex) && (1 < pSVar12->columns)) {
                  z_expr._M_dataplus._M_p = z_expr._M_dataplus._M_p & 0xffffffff00000000;
                  do {
                    CompilerGLSL::
                    statement<std::__cxx11::string&,char_const(&)[2],unsigned_int&,char_const(&)[17],std::__cxx11::string&,char_const(&)[2],unsigned_int&,char_const(&)[2]>
                              (&this->super_CompilerGLSL,&x_expr,(char (*) [2])0x2f169e,
                               (uint *)&z_expr,(char (*) [17])"] = stage_input.",&x_expr,
                               (char (*) [2])0x2e3de5,(uint *)&z_expr,(char (*) [2])0x2d9bde);
                    uVar10 = (uint)z_expr._M_dataplus._M_p + 1;
                    z_expr._M_dataplus._M_p._0_4_ = uVar10;
                  } while (uVar10 < pSVar12->columns);
                }
                else {
                  CompilerGLSL::
                  statement<std::__cxx11::string&,char_const(&)[16],std::__cxx11::string&,char_const(&)[2]>
                            (&this->super_CompilerGLSL,&x_expr,(char (*) [16])0x2e598a,&x_expr,
                             (char (*) [2])0x2d9bde);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)x_expr._M_dataplus._M_p != &x_expr.field_2) goto LAB_002171fd;
              }
            }
          }
          else {
            bVar8 = Compiler::is_builtin_variable((Compiler *)this,pSVar11);
            if ((!bVar8) &&
               (bVar8 = Compiler::interface_variable_exists_in_entry_point
                                  ((Compiler *)this,(pSVar11->super_IVariant).self.id), bVar8)) {
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                        (&x_expr,this,(ulong)(pSVar11->super_IVariant).self.id,1);
              CompilerGLSL::
              statement<std::__cxx11::string&,char_const(&)[15],std::__cxx11::string&,char_const(&)[2]>
                        (&this->super_CompilerGLSL,&x_expr,(char (*) [15])" = stage_input",&x_expr,
                         (char (*) [2])0x2d9bde);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)x_expr._M_dataplus._M_p != &x_expr.field_2) {
LAB_002171fd:
                operator_delete(x_expr._M_dataplus._M_p);
              }
            }
          }
        }
      }
      pTVar21 = pTVar21 + 1;
    } while (pTVar21 != pTVar25);
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)&y_expr);
  EVar2 = pSVar14->model;
  if (EVar2 == ExecutionModelGLCompute) {
    pcVar18 = "comp_main();";
  }
  else if (EVar2 == ExecutionModelFragment) {
    pcVar18 = "frag_main();";
  }
  else {
    if (EVar2 != ExecutionModelVertex) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      x_expr._M_dataplus._M_p = (pointer)&x_expr.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&x_expr,"Unsupported shader stage.","");
      ::std::runtime_error::runtime_error(this_01,(string *)&x_expr);
      *(undefined ***)this_01 = &PTR__runtime_error_00357118;
      __cxa_throw(this_01,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    pcVar18 = "vert_main();";
  }
  CompilerGLSL::statement<char_const(&)[13]>(&this->super_CompilerGLSL,(char (*) [13])pcVar18);
  ParsedIR::create_loop_hard_lock(this_00);
  sVar3 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar3 != 0) {
    pTVar21 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    lVar28 = 0;
    do {
      uVar10 = *(uint *)((long)&pTVar21->id + lVar28);
      pVVar4 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar4[uVar10].type == TypeVariable) {
        pSVar11 = Variant::get<spirv_cross::SPIRVariable>(pVVar4 + uVar10);
        pSVar12 = Variant::get<spirv_cross::SPIRType>
                            ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                             super_VectorView<spirv_cross::Variant>.ptr +
                             *(uint *)&(pSVar11->super_IVariant).field_0xc);
        pmVar13 = ::std::__detail::
                  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&(this->super_CompilerGLSL).super_Compiler.ir.meta,
                               &(pSVar12->super_IVariant).self);
        if ((((pSVar11->storage == StorageClassOutput) &&
             (((pmVar13->decoration).decoration_flags.lower & 4) != 0)) &&
            (bVar8 = Compiler::is_builtin_variable((Compiler *)this,pSVar11), !bVar8)) &&
           (bVar8 = Compiler::interface_variable_exists_in_entry_point
                              ((Compiler *)this,(pSVar11->super_IVariant).self.id), bVar8)) {
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                    (&x_expr,this,(ulong)(pSVar11->super_IVariant).self.id,1);
          CompilerGLSL::
          statement<char_const(&)[13],std::__cxx11::string&,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                    (&this->super_CompilerGLSL,(char (*) [13])"stage_output",&x_expr,
                     (char (*) [4])0x2f38c7,&x_expr,(char (*) [2])0x2d9bde);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)x_expr._M_dataplus._M_p != &x_expr.field_2) {
            operator_delete(x_expr._M_dataplus._M_p);
          }
        }
      }
      lVar28 = lVar28 + 4;
    } while (sVar3 << 2 != lVar28);
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)&y_expr);
  if (this->require_output == true) {
    CompilerGLSL::statement<char_const(&)[33]>
              (&this->super_CompilerGLSL,(char (*) [33])"SPIRV_Cross_Output stage_output;");
    uVar29 = 0;
    do {
      if (((this->super_CompilerGLSL).super_Compiler.active_output_builtins.lower >> (uVar29 & 0x3f)
          & 1) != 0) {
        emit_hlsl_entry_point::anon_class_8_1_8991fb9c::operator()
                  ((anon_class_8_1_8991fb9c *)this,(uint32_t)uVar29);
      }
      uVar29 = uVar29 + 1;
    } while (uVar29 != 0x40);
    sVar3 = (this->super_CompilerGLSL).super_Compiler.active_output_builtins.higher._M_h.
            _M_element_count;
    if (sVar3 != 0) {
      pcVar5 = (pointer)((long)&x_expr.field_2 + 8);
      x_expr._M_string_length = 0;
      x_expr.field_2._M_allocated_capacity = 8;
      x_expr._M_dataplus._M_p = pcVar5;
      SmallVector<unsigned_int,_8UL>::reserve((SmallVector<unsigned_int,_8UL> *)&x_expr,sVar3);
      p_Var26 = (this->super_CompilerGLSL).super_Compiler.active_output_builtins.higher._M_h.
                _M_before_begin._M_nxt;
      if (p_Var26 != (_Hash_node_base *)0x0) {
        do {
          SmallVector<unsigned_int,_8UL>::reserve
                    ((SmallVector<unsigned_int,_8UL> *)&x_expr,x_expr._M_string_length + 1);
          *(undefined4 *)(x_expr._M_dataplus._M_p + x_expr._M_string_length * 4) =
               *(undefined4 *)&p_Var26[1]._M_nxt;
          x_expr._M_string_length = x_expr._M_string_length + 1;
          p_Var26 = p_Var26->_M_nxt;
        } while (p_Var26 != (_Hash_node_base *)0x0);
      }
      _Var6._M_p = x_expr._M_dataplus._M_p;
      if (x_expr._M_string_length != 0) {
        pcVar1 = x_expr._M_dataplus._M_p + x_expr._M_string_length * 4;
        lVar28 = 0x3f;
        if (x_expr._M_string_length != 0) {
          for (; x_expr._M_string_length >> lVar28 == 0; lVar28 = lVar28 + -1) {
          }
        }
        ::std::__introsort_loop<unsigned_int*,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (x_expr._M_dataplus._M_p,pcVar1,((uint)lVar28 ^ 0x3f) * 2 ^ 0x7e);
        ::std::__final_insertion_sort<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>
                  (_Var6._M_p,pcVar1);
        _Var6 = x_expr._M_dataplus;
        if (x_expr._M_string_length != 0) {
          lVar24 = x_expr._M_string_length << 2;
          lVar28 = 0;
          do {
            emit_hlsl_entry_point::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)this,*(uint32_t *)(_Var6._M_p + lVar28));
            lVar28 = lVar28 + 4;
          } while (lVar24 != lVar28);
        }
      }
      x_expr._M_string_length = 0;
      if (x_expr._M_dataplus._M_p != pcVar5) {
        free(x_expr._M_dataplus._M_p);
      }
    }
    ParsedIR::create_loop_hard_lock(this_00);
    sVar3 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
    if (sVar3 != 0) {
      pTVar21 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
      pTVar25 = pTVar21 + sVar3;
      do {
        pVVar4 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                 super_VectorView<spirv_cross::Variant>.ptr;
        if (pVVar4[pTVar21->id].type == TypeVariable) {
          pSVar11 = Variant::get<spirv_cross::SPIRVariable>(pVVar4 + pTVar21->id);
          pSVar12 = Variant::get<spirv_cross::SPIRType>
                              ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                               super_VectorView<spirv_cross::Variant>.ptr +
                               *(uint *)&(pSVar11->super_IVariant).field_0xc);
          pmVar13 = ::std::__detail::
                    _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&(this->super_CompilerGLSL).super_Compiler.ir.meta,
                                 &(pSVar12->super_IVariant).self);
          if ((((pSVar11->storage == StorageClassOutput) &&
               (((pmVar13->decoration).decoration_flags.lower & 4) == 0)) &&
              ((pSVar11->remapped_variable == false &&
               ((pSVar12->pointer == true &&
                (bVar8 = Compiler::is_builtin_variable((Compiler *)this,pSVar11), !bVar8)))))) &&
             (bVar8 = Compiler::interface_variable_exists_in_entry_point
                                ((Compiler *)this,(pSVar11->super_IVariant).self.id), bVar8)) {
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                      (&x_expr,this,(ulong)(pSVar11->super_IVariant).self.id,1);
            if ((legacy == true) && (pSVar14->model == ExecutionModelFragment)) {
              y_expr._M_dataplus._M_p = (pointer)&y_expr.field_2;
              y_expr._M_string_length = 0;
              y_expr.field_2._M_local_buf[0] = '\0';
              if (pSVar12->vecsize < 4) {
                iVar27 = pSVar12->vecsize - 4;
                do {
                  ::std::__cxx11::string::append((char *)&y_expr);
                  iVar27 = iVar27 + 1;
                } while (iVar27 != 0);
              }
              CompilerGLSL::
              statement<char_const(&)[14],std::__cxx11::string&,char_const(&)[11],std::__cxx11::string&,std::__cxx11::string&,char_const(&)[3]>
                        (&this->super_CompilerGLSL,(char (*) [14])"stage_output.",&x_expr,
                         (char (*) [11])" = float4(",&x_expr,&y_expr,(char (*) [3])0x2d9bdd);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)y_expr._M_dataplus._M_p != &y_expr.field_2) {
                operator_delete(y_expr._M_dataplus._M_p);
              }
            }
            else {
              CompilerGLSL::
              statement<char_const(&)[14],std::__cxx11::string&,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                        (&this->super_CompilerGLSL,(char (*) [14])"stage_output.",&x_expr,
                         (char (*) [4])0x2f38c7,&x_expr,(char (*) [2])0x2d9bde);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)x_expr._M_dataplus._M_p != &x_expr.field_2) {
              operator_delete(x_expr._M_dataplus._M_p);
            }
          }
        }
        pTVar21 = pTVar21 + 1;
      } while (pTVar21 != pTVar25);
    }
    ParsedIR::LoopLock::~LoopLock((LoopLock *)&z_expr);
    CompilerGLSL::statement<char_const(&)[21]>
              (&this->super_CompilerGLSL,(char (*) [21])"return stage_output;");
  }
  CompilerGLSL::end_scope(&this->super_CompilerGLSL);
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::~SmallVector(&arguments);
  return;
}

Assistant:

void CompilerHLSL::emit_hlsl_entry_point()
{
	SmallVector<string> arguments;

	if (require_input)
		arguments.push_back("SPIRV_Cross_Input stage_input");

	// Add I/O blocks as separate arguments with appropriate storage qualifier.
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);
		bool block = ir.meta[type.self].decoration.decoration_flags.get(DecorationBlock);

		if (var.storage != StorageClassInput && var.storage != StorageClassOutput)
			return;

		if (block && !is_builtin_variable(var) && interface_variable_exists_in_entry_point(var.self))
		{
			if (var.storage == StorageClassInput)
			{
				arguments.push_back(join("in ", variable_decl(type, join("stage_input", to_name(var.self)))));
			}
			else if (var.storage == StorageClassOutput)
			{
				arguments.push_back(join("out ", variable_decl(type, join("stage_output", to_name(var.self)))));
			}
		}
	});

	auto &execution = get_entry_point();

	switch (execution.model)
	{
	case ExecutionModelGLCompute:
	{
		SpecializationConstant wg_x, wg_y, wg_z;
		get_work_group_size_specialization_constants(wg_x, wg_y, wg_z);

		uint32_t x = execution.workgroup_size.x;
		uint32_t y = execution.workgroup_size.y;
		uint32_t z = execution.workgroup_size.z;

		auto x_expr = wg_x.id ? get<SPIRConstant>(wg_x.id).specialization_constant_macro_name : to_string(x);
		auto y_expr = wg_y.id ? get<SPIRConstant>(wg_y.id).specialization_constant_macro_name : to_string(y);
		auto z_expr = wg_z.id ? get<SPIRConstant>(wg_z.id).specialization_constant_macro_name : to_string(z);

		statement("[numthreads(", x_expr, ", ", y_expr, ", ", z_expr, ")]");
		break;
	}
	case ExecutionModelFragment:
		if (execution.flags.get(ExecutionModeEarlyFragmentTests))
			statement("[earlydepthstencil]");
		break;
	default:
		break;
	}

	statement(require_output ? "SPIRV_Cross_Output " : "void ", "main(", merge(arguments), ")");
	begin_scope();
	bool legacy = hlsl_options.shader_model <= 30;

	// Copy builtins from entry point arguments to globals.
	active_input_builtins.for_each_bit([&](uint32_t i) {
		auto builtin = builtin_to_glsl(static_cast<BuiltIn>(i), StorageClassInput);
		switch (static_cast<BuiltIn>(i))
		{
		case BuiltInFragCoord:
			// VPOS in D3D9 is sampled at integer locations, apply half-pixel offset to be consistent.
			// TODO: Do we need an option here? Any reason why a D3D9 shader would be used
			// on a D3D10+ system with a different rasterization config?
			if (legacy)
				statement(builtin, " = stage_input.", builtin, " + float4(0.5f, 0.5f, 0.0f, 0.0f);");
			else
			{
				statement(builtin, " = stage_input.", builtin, ";");
				// ZW are undefined in D3D9, only do this fixup here.
				statement(builtin, ".w = 1.0 / ", builtin, ".w;");
			}
			break;

		case BuiltInVertexId:
		case BuiltInVertexIndex:
		case BuiltInInstanceIndex:
			// D3D semantics are uint, but shader wants int.
			if (hlsl_options.support_nonzero_base_vertex_base_instance)
			{
				if (static_cast<BuiltIn>(i) == BuiltInInstanceIndex)
					statement(builtin, " = int(stage_input.", builtin, ") + SPIRV_Cross_BaseInstance;");
				else
					statement(builtin, " = int(stage_input.", builtin, ") + SPIRV_Cross_BaseVertex;");
			}
			else
				statement(builtin, " = int(stage_input.", builtin, ");");
			break;

		case BuiltInInstanceId:
			// D3D semantics are uint, but shader wants int.
			statement(builtin, " = int(stage_input.", builtin, ");");
			break;

		case BuiltInNumWorkgroups:
		case BuiltInPointCoord:
		case BuiltInSubgroupSize:
		case BuiltInSubgroupLocalInvocationId:
			break;

		case BuiltInSubgroupEqMask:
			// Emulate these ...
			// No 64-bit in HLSL, so have to do it in 32-bit and unroll.
			statement("gl_SubgroupEqMask = 1u << (WaveGetLaneIndex() - uint4(0, 32, 64, 96));");
			statement("if (WaveGetLaneIndex() >= 32) gl_SubgroupEqMask.x = 0;");
			statement("if (WaveGetLaneIndex() >= 64 || WaveGetLaneIndex() < 32) gl_SubgroupEqMask.y = 0;");
			statement("if (WaveGetLaneIndex() >= 96 || WaveGetLaneIndex() < 64) gl_SubgroupEqMask.z = 0;");
			statement("if (WaveGetLaneIndex() < 96) gl_SubgroupEqMask.w = 0;");
			break;

		case BuiltInSubgroupGeMask:
			// Emulate these ...
			// No 64-bit in HLSL, so have to do it in 32-bit and unroll.
			statement("gl_SubgroupGeMask = ~((1u << (WaveGetLaneIndex() - uint4(0, 32, 64, 96))) - 1u);");
			statement("if (WaveGetLaneIndex() >= 32) gl_SubgroupGeMask.x = 0u;");
			statement("if (WaveGetLaneIndex() >= 64) gl_SubgroupGeMask.y = 0u;");
			statement("if (WaveGetLaneIndex() >= 96) gl_SubgroupGeMask.z = 0u;");
			statement("if (WaveGetLaneIndex() < 32) gl_SubgroupGeMask.y = ~0u;");
			statement("if (WaveGetLaneIndex() < 64) gl_SubgroupGeMask.z = ~0u;");
			statement("if (WaveGetLaneIndex() < 96) gl_SubgroupGeMask.w = ~0u;");
			break;

		case BuiltInSubgroupGtMask:
			// Emulate these ...
			// No 64-bit in HLSL, so have to do it in 32-bit and unroll.
			statement("uint gt_lane_index = WaveGetLaneIndex() + 1;");
			statement("gl_SubgroupGtMask = ~((1u << (gt_lane_index - uint4(0, 32, 64, 96))) - 1u);");
			statement("if (gt_lane_index >= 32) gl_SubgroupGtMask.x = 0u;");
			statement("if (gt_lane_index >= 64) gl_SubgroupGtMask.y = 0u;");
			statement("if (gt_lane_index >= 96) gl_SubgroupGtMask.z = 0u;");
			statement("if (gt_lane_index >= 128) gl_SubgroupGtMask.w = 0u;");
			statement("if (gt_lane_index < 32) gl_SubgroupGtMask.y = ~0u;");
			statement("if (gt_lane_index < 64) gl_SubgroupGtMask.z = ~0u;");
			statement("if (gt_lane_index < 96) gl_SubgroupGtMask.w = ~0u;");
			break;

		case BuiltInSubgroupLeMask:
			// Emulate these ...
			// No 64-bit in HLSL, so have to do it in 32-bit and unroll.
			statement("uint le_lane_index = WaveGetLaneIndex() + 1;");
			statement("gl_SubgroupLeMask = (1u << (le_lane_index - uint4(0, 32, 64, 96))) - 1u;");
			statement("if (le_lane_index >= 32) gl_SubgroupLeMask.x = ~0u;");
			statement("if (le_lane_index >= 64) gl_SubgroupLeMask.y = ~0u;");
			statement("if (le_lane_index >= 96) gl_SubgroupLeMask.z = ~0u;");
			statement("if (le_lane_index >= 128) gl_SubgroupLeMask.w = ~0u;");
			statement("if (le_lane_index < 32) gl_SubgroupLeMask.y = 0u;");
			statement("if (le_lane_index < 64) gl_SubgroupLeMask.z = 0u;");
			statement("if (le_lane_index < 96) gl_SubgroupLeMask.w = 0u;");
			break;

		case BuiltInSubgroupLtMask:
			// Emulate these ...
			// No 64-bit in HLSL, so have to do it in 32-bit and unroll.
			statement("gl_SubgroupLtMask = (1u << (WaveGetLaneIndex() - uint4(0, 32, 64, 96))) - 1u;");
			statement("if (WaveGetLaneIndex() >= 32) gl_SubgroupLtMask.x = ~0u;");
			statement("if (WaveGetLaneIndex() >= 64) gl_SubgroupLtMask.y = ~0u;");
			statement("if (WaveGetLaneIndex() >= 96) gl_SubgroupLtMask.z = ~0u;");
			statement("if (WaveGetLaneIndex() < 32) gl_SubgroupLtMask.y = 0u;");
			statement("if (WaveGetLaneIndex() < 64) gl_SubgroupLtMask.z = 0u;");
			statement("if (WaveGetLaneIndex() < 96) gl_SubgroupLtMask.w = 0u;");
			break;

		case BuiltInClipDistance:
			for (uint32_t clip = 0; clip < clip_distance_count; clip++)
				statement("gl_ClipDistance[", clip, "] = stage_input.gl_ClipDistance", clip / 4, ".", "xyzw"[clip & 3],
				          ";");
			break;

		case BuiltInCullDistance:
			for (uint32_t cull = 0; cull < cull_distance_count; cull++)
				statement("gl_CullDistance[", cull, "] = stage_input.gl_CullDistance", cull / 4, ".", "xyzw"[cull & 3],
				          ";");
			break;

		default:
			statement(builtin, " = stage_input.", builtin, ";");
			break;
		}
	});

	// Copy from stage input struct to globals.
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);
		bool block = ir.meta[type.self].decoration.decoration_flags.get(DecorationBlock);

		if (var.storage != StorageClassInput)
			return;

		bool need_matrix_unroll = var.storage == StorageClassInput && execution.model == ExecutionModelVertex;

		if (!block && !var.remapped_variable && type.pointer && !is_builtin_variable(var) &&
		    interface_variable_exists_in_entry_point(var.self))
		{
			auto name = to_name(var.self);
			auto &mtype = this->get<SPIRType>(var.basetype);
			if (need_matrix_unroll && mtype.columns > 1)
			{
				// Unroll matrices.
				for (uint32_t col = 0; col < mtype.columns; col++)
					statement(name, "[", col, "] = stage_input.", name, "_", col, ";");
			}
			else
			{
				statement(name, " = stage_input.", name, ";");
			}
		}

		// I/O blocks don't use the common stage input/output struct, but separate outputs.
		if (block && !is_builtin_variable(var) && interface_variable_exists_in_entry_point(var.self))
		{
			auto name = to_name(var.self);
			statement(name, " = stage_input", name, ";");
		}
	});

	// Run the shader.
	if (execution.model == ExecutionModelVertex)
		statement("vert_main();");
	else if (execution.model == ExecutionModelFragment)
		statement("frag_main();");
	else if (execution.model == ExecutionModelGLCompute)
		statement("comp_main();");
	else
		SPIRV_CROSS_THROW("Unsupported shader stage.");

	// Copy block outputs.
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);
		bool block = ir.meta[type.self].decoration.decoration_flags.get(DecorationBlock);

		if (var.storage != StorageClassOutput)
			return;

		// I/O blocks don't use the common stage input/output struct, but separate outputs.
		if (block && !is_builtin_variable(var) && interface_variable_exists_in_entry_point(var.self))
		{
			auto name = to_name(var.self);
			statement("stage_output", name, " = ", name, ";");
		}
	});

	// Copy stage outputs.
	if (require_output)
	{
		statement("SPIRV_Cross_Output stage_output;");

		// Copy builtins from globals to return struct.
		active_output_builtins.for_each_bit([&](uint32_t i) {
			// PointSize doesn't exist in HLSL.
			if (i == BuiltInPointSize)
				return;

			switch (static_cast<BuiltIn>(i))
			{
			case BuiltInClipDistance:
				for (uint32_t clip = 0; clip < clip_distance_count; clip++)
					statement("stage_output.gl_ClipDistance", clip / 4, ".", "xyzw"[clip & 3], " = gl_ClipDistance[",
					          clip, "];");
				break;

			case BuiltInCullDistance:
				for (uint32_t cull = 0; cull < cull_distance_count; cull++)
					statement("stage_output.gl_CullDistance", cull / 4, ".", "xyzw"[cull & 3], " = gl_CullDistance[",
					          cull, "];");
				break;

			default:
			{
				auto builtin_expr = builtin_to_glsl(static_cast<BuiltIn>(i), StorageClassOutput);
				statement("stage_output.", builtin_expr, " = ", builtin_expr, ";");
				break;
			}
			}
		});

		ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
			auto &type = this->get<SPIRType>(var.basetype);
			bool block = ir.meta[type.self].decoration.decoration_flags.get(DecorationBlock);

			if (var.storage != StorageClassOutput)
				return;

			if (!block && var.storage != StorageClassFunction && !var.remapped_variable && type.pointer &&
			    !is_builtin_variable(var) && interface_variable_exists_in_entry_point(var.self))
			{
				auto name = to_name(var.self);

				if (legacy && execution.model == ExecutionModelFragment)
				{
					string output_filler;
					for (uint32_t size = type.vecsize; size < 4; ++size)
						output_filler += ", 0.0";

					statement("stage_output.", name, " = float4(", name, output_filler, ");");
				}
				else
				{
					statement("stage_output.", name, " = ", name, ";");
				}
			}
		});

		statement("return stage_output;");
	}

	end_scope();
}